

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall Highs::scaleRowInterface(Highs *this,HighsInt row,double scale_value)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  pointer pHVar1;
  pointer pcVar2;
  HighsStatus HVar3;
  long lVar4;
  HighsBasisStatus HVar5;
  char cVar6;
  string local_b8;
  HighsLogOptions local_98;
  
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  if ((scale_value == 0.0) && (!NAN(scale_value))) {
    return kError;
  }
  if (row < 0) {
    return kError;
  }
  if ((this->model_).lp_.num_row_ <= row) {
    return kError;
  }
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_98.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar3 = applyScalingToLpRow(&(this->model_).lp_,row,scale_value);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"applyScalingToLpRow","");
  HVar3 = interpretCallStatus(&local_98,HVar3,kOk,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if (HVar3 == kError) {
    return kError;
  }
  if (0.0 <= scale_value) goto LAB_0022f271;
  if ((this->basis_).valid == true) {
    pHVar1 = (this->basis_).row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar5 = pHVar1[(uint)row];
    if (HVar5 == kLower) {
      HVar5 = kUpper;
    }
    else {
      if (HVar5 != kUpper) goto LAB_0022f231;
      HVar5 = kLower;
    }
    pHVar1[(uint)row] = HVar5;
  }
LAB_0022f231:
  if (((this->ekk_instance_).status_.initialised_for_solve == true) &&
     ((this->ekk_instance_).status_.has_basis == true)) {
    lVar4 = (long)row + (long)(this->model_).lp_.num_col_;
    pcVar2 = (this->ekk_instance_).basis_.nonbasicMove_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar6 = pcVar2[lVar4];
    if (cVar6 == '\x01') {
      cVar6 = -1;
    }
    else {
      if (cVar6 != -1) goto LAB_0022f271;
      cVar6 = '\x01';
    }
    pcVar2[lVar4] = cVar6;
  }
LAB_0022f271:
  invalidateModelStatusSolutionAndInfo(this);
  HEkk::updateStatus(&this->ekk_instance_,kScaledRow);
  return kOk;
}

Assistant:

HighsStatus Highs::scaleRowInterface(const HighsInt row,
                                     const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsSimplexStatus& simplex_status = ekk_instance_.status_;

  // Ensure that the LP is column-wise
  lp.ensureColwise();

  if (row < 0) return HighsStatus::kError;
  if (row >= lp.num_row_) return HighsStatus::kError;
  if (!scale_value) return HighsStatus::kError;

  return_status = interpretCallStatus(options_.log_options,
                                      applyScalingToLpRow(lp, row, scale_value),
                                      return_status, "applyScalingToLpRow");
  if (return_status == HighsStatus::kError) return return_status;

  if (scale_value < 0 && basis.valid) {
    // Negative, so flip any nonbasic status
    if (basis.row_status[row] == HighsBasisStatus::kLower) {
      basis.row_status[row] = HighsBasisStatus::kUpper;
    } else if (basis.row_status[row] == HighsBasisStatus::kUpper) {
      basis.row_status[row] = HighsBasisStatus::kLower;
    }
  }
  if (simplex_status.initialised_for_solve) {
    SimplexBasis& simplex_basis = ekk_instance_.basis_;
    if (scale_value < 0 && simplex_status.has_basis) {
      // Negative, so flip any nonbasic status
      const HighsInt var = lp.num_col_ + row;
      if (simplex_basis.nonbasicMove_[var] == kNonbasicMoveUp) {
        simplex_basis.nonbasicMove_[var] = kNonbasicMoveDn;
      } else if (simplex_basis.nonbasicMove_[var] == kNonbasicMoveDn) {
        simplex_basis.nonbasicMove_[var] = kNonbasicMoveUp;
      }
    }
  }
  // Deduce the consequences of a scaled row
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kScaledRow);
  return HighsStatus::kOk;
}